

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::InsertLocalMinimaIntoAEL(Clipper *this,cInt botY)

{
  TEdge *edge;
  TEdge *edge_00;
  value_type pJVar1;
  bool bVar2;
  size_type sVar3;
  Join *pJVar4;
  reference ppJVar5;
  OutPt *pOVar6;
  TEdge *local_110;
  TEdge *e;
  OutPt *Op2_1;
  OutPt *Op2;
  Join *jr;
  size_type i;
  OutPt *Op1;
  TEdge *rb;
  TEdge *lb;
  LocalMinimum *lm;
  cInt botY_local;
  Clipper *this_local;
  
  lm = (LocalMinimum *)botY;
  botY_local = (cInt)this;
  while (bVar2 = ClipperBase::PopLocalMinima
                           ((ClipperBase *)
                            ((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),(cInt)lm,
                            (LocalMinimum **)&lb), bVar2) {
    edge = (TEdge *)(lb->Bot).Y;
    edge_00 = (TEdge *)(lb->Curr).X;
    i = 0;
    if (edge == (TEdge *)0x0) {
      InsertEdgeIntoAEL(this,edge_00,(TEdge *)0x0);
      SetWindingCount(this,edge_00);
      bVar2 = IsContributing(this,edge_00);
      if (bVar2) {
        i = (size_type)AddOutPt(this,edge_00,(IntPoint *)edge_00);
      }
    }
    else if (edge_00 == (TEdge *)0x0) {
      InsertEdgeIntoAEL(this,edge,(TEdge *)0x0);
      SetWindingCount(this,edge);
      bVar2 = IsContributing(this,edge);
      if (bVar2) {
        i = (size_type)AddOutPt(this,edge,(IntPoint *)edge);
      }
      ClipperBase::InsertScanbeam
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                 (edge->Top).Y);
    }
    else {
      InsertEdgeIntoAEL(this,edge,(TEdge *)0x0);
      InsertEdgeIntoAEL(this,edge_00,edge);
      SetWindingCount(this,edge);
      edge_00->WindCnt = edge->WindCnt;
      edge_00->WindCnt2 = edge->WindCnt2;
      bVar2 = IsContributing(this,edge);
      if (bVar2) {
        i = (size_type)AddLocalMinPoly(this,edge,edge_00,(IntPoint *)edge);
      }
      ClipperBase::InsertScanbeam
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                 (edge->Top).Y);
    }
    if (edge_00 != (TEdge *)0x0) {
      bVar2 = IsHorizontal(edge_00);
      if (bVar2) {
        AddEdgeToSEL(this,edge_00);
        if (edge_00->NextInLML != (TEdge *)0x0) {
          ClipperBase::InsertScanbeam
                    ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                     (edge_00->NextInLML->Top).Y);
        }
      }
      else {
        ClipperBase::InsertScanbeam
                  ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                   (edge_00->Top).Y);
      }
    }
    if ((edge != (TEdge *)0x0) && (edge_00 != (TEdge *)0x0)) {
      if ((i != 0) &&
         (((bVar2 = IsHorizontal(edge_00), bVar2 &&
           (sVar3 = std::vector<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>::size
                              (&this->m_GhostJoins), sVar3 != 0)) && (edge_00->WindDelta != 0)))) {
        for (jr = (Join *)0x0;
            pJVar4 = (Join *)std::vector<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>::
                             size(&this->m_GhostJoins), jr < pJVar4;
            jr = (Join *)((long)&jr->OutPt1 + 1)) {
          ppJVar5 = std::vector<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>::operator[]
                              (&this->m_GhostJoins,(size_type)jr);
          pJVar1 = *ppJVar5;
          bVar2 = HorzSegmentsOverlap((pJVar1->OutPt1->Pt).X,(pJVar1->OffPt).X,(edge_00->Bot).X,
                                      (edge_00->Top).X);
          if (bVar2) {
            AddJoin(this,pJVar1->OutPt1,(OutPt *)i,pJVar1->OffPt);
          }
        }
      }
      if (((((-1 < edge->OutIdx) && (edge->PrevInAEL != (TEdge *)0x0)) &&
           (((edge->PrevInAEL->Curr).X == (edge->Bot).X &&
            ((-1 < edge->PrevInAEL->OutIdx &&
             (bVar2 = SlopesEqual(edge->PrevInAEL->Bot,edge->PrevInAEL->Top,edge->Curr,edge->Top,
                                  (bool)((byte)(this->_vptr_Clipper[-3] + 8)
                                               [(long)&(this->m_GhostJoins).
                                                                                                              
                                                  super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                               ] & 1)), bVar2)))))) && (edge->WindDelta != 0)) &&
         (edge->PrevInAEL->WindDelta != 0)) {
        pOVar6 = AddOutPt(this,edge->PrevInAEL,(IntPoint *)edge);
        AddJoin(this,(OutPt *)i,pOVar6,edge->Top);
      }
      if (edge->NextInAEL != edge_00) {
        if ((((-1 < edge_00->OutIdx) && (-1 < edge_00->PrevInAEL->OutIdx)) &&
            (bVar2 = SlopesEqual(edge_00->PrevInAEL->Curr,edge_00->PrevInAEL->Top,edge_00->Curr,
                                 edge_00->Top,
                                 (bool)((byte)(this->_vptr_Clipper[-3] + 8)
                                              [(long)&(this->m_GhostJoins).
                                                                                                            
                                                  super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                              ] & 1)), bVar2)) &&
           ((edge_00->WindDelta != 0 && (edge_00->PrevInAEL->WindDelta != 0)))) {
          pOVar6 = AddOutPt(this,edge_00->PrevInAEL,(IntPoint *)edge_00);
          AddJoin(this,(OutPt *)i,pOVar6,edge_00->Top);
        }
        local_110 = edge->NextInAEL;
        if (local_110 != (TEdge *)0x0) {
          for (; local_110 != edge_00; local_110 = local_110->NextInAEL) {
            IntersectEdges(this,edge_00,local_110,&edge->Curr);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Clipper::InsertLocalMinimaIntoAEL(const cInt botY)
{
  const LocalMinimum *lm;
  while (PopLocalMinima(botY, lm))
  {
    TEdge* lb = lm->LeftBound;
    TEdge* rb = lm->RightBound;
    
    OutPt *Op1 = 0;
    if (!lb)
    {
      //nb: don't insert LB into either AEL or SEL
      InsertEdgeIntoAEL(rb, 0);
      SetWindingCount(*rb);
      if (IsContributing(*rb))
        Op1 = AddOutPt(rb, rb->Bot); 
    } 
    else if (!rb)
    {
      InsertEdgeIntoAEL(lb, 0);
      SetWindingCount(*lb);
      if (IsContributing(*lb))
        Op1 = AddOutPt(lb, lb->Bot);
      InsertScanbeam(lb->Top.Y);
    }
    else
    {
      InsertEdgeIntoAEL(lb, 0);
      InsertEdgeIntoAEL(rb, lb);
      SetWindingCount( *lb );
      rb->WindCnt = lb->WindCnt;
      rb->WindCnt2 = lb->WindCnt2;
      if (IsContributing(*lb))
        Op1 = AddLocalMinPoly(lb, rb, lb->Bot);      
      InsertScanbeam(lb->Top.Y);
    }

     if (rb)
     {
		 if (IsHorizontal(*rb))
		 {
			 AddEdgeToSEL(rb);
			 if (rb->NextInLML) 
				 InsertScanbeam(rb->NextInLML->Top.Y);
		 }
		 else InsertScanbeam( rb->Top.Y );
     }

    if (!lb || !rb) continue;

    //if any output polygons share an edge, they'll need joining later ...
    if (Op1 && IsHorizontal(*rb) && 
      m_GhostJoins.size() > 0 && (rb->WindDelta != 0))
    {
      for (JoinList::size_type i = 0; i < m_GhostJoins.size(); ++i)
      {
        Join* jr = m_GhostJoins[i];
        //if the horizontal Rb and a 'ghost' horizontal overlap, then convert
        //the 'ghost' join to a real join ready for later ...
        if (HorzSegmentsOverlap(jr->OutPt1->Pt.X, jr->OffPt.X, rb->Bot.X, rb->Top.X))
          AddJoin(jr->OutPt1, Op1, jr->OffPt);
      }
    }

    if (lb->OutIdx >= 0 && lb->PrevInAEL && 
      lb->PrevInAEL->Curr.X == lb->Bot.X &&
      lb->PrevInAEL->OutIdx >= 0 &&
      SlopesEqual(lb->PrevInAEL->Bot, lb->PrevInAEL->Top, lb->Curr, lb->Top, m_UseFullRange) &&
      (lb->WindDelta != 0) && (lb->PrevInAEL->WindDelta != 0))
    {
        OutPt *Op2 = AddOutPt(lb->PrevInAEL, lb->Bot);
        AddJoin(Op1, Op2, lb->Top);
    }

    if(lb->NextInAEL != rb)
    {

      if (rb->OutIdx >= 0 && rb->PrevInAEL->OutIdx >= 0 &&
        SlopesEqual(rb->PrevInAEL->Curr, rb->PrevInAEL->Top, rb->Curr, rb->Top, m_UseFullRange) &&
        (rb->WindDelta != 0) && (rb->PrevInAEL->WindDelta != 0))
      {
          OutPt *Op2 = AddOutPt(rb->PrevInAEL, rb->Bot);
          AddJoin(Op1, Op2, rb->Top);
      }

      TEdge* e = lb->NextInAEL;
      if (e)
      {
        while( e != rb )
        {
          //nb: For calculating winding counts etc, IntersectEdges() assumes
          //that param1 will be to the Right of param2 ABOVE the intersection ...
          IntersectEdges(rb , e , lb->Curr); //order important here
          e = e->NextInAEL;
        }
      }
    }
    
  }
}